

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal.cpp
# Opt level: O0

void PALCommonCleanup(void)

{
  if (!PALCommonCleanup::cleanupDone) {
    PALCommonCleanup::cleanupDone = true;
    PALSetShutdownIntent();
    CorUnix::CPalSynchMgrController::PrepareForShutdown();
    PROCDumpThreadList();
  }
  return;
}

Assistant:

void
PALCommonCleanup()
{
    static bool cleanupDone = false;

    if (!cleanupDone)
    {
        cleanupDone = true;

        PALSetShutdownIntent();

        //
        // Let the synchronization manager know we're about to shutdown
        //

        CPalSynchMgrController::PrepareForShutdown();

#ifdef _DEBUG
        PROCDumpThreadList();
#endif
    }
}